

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

void GC::CheckClass(char *ptr,ExternTypeInfo *type)

{
  uint uVar1;
  char *__function;
  ulong uVar2;
  uint *puVar3;
  
  if ((type->nameHash == objectName) || (type->nameHash == autoArrayName)) {
    if (*(long *)(ptr + 4) != 0) {
      CheckPointer(ptr + 4);
      return;
    }
  }
  else if (type->pointerCount != 0) {
    uVar1 = (type->field_8).arrSize + (type->field_11).subType;
    if (*(uint *)(NULLC::commonLinker + 0x21c) <= uVar1) {
      __function = 
      "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
      ;
LAB_0013f1d4:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x7f,__function);
    }
    puVar3 = (uint *)(*(long *)(NULLC::commonLinker + 0x210) + (ulong)uVar1 * 0xc + 8);
    uVar2 = 0;
    do {
      if (*(uint *)(NULLC::commonLinker + 0x20c) <= puVar3[-2]) {
        __function = 
        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_0013f1d4;
      }
      CheckVariable(ptr + *puVar3,
                    (ExternTypeInfo *)
                    ((ulong)puVar3[-2] * 0x50 + *(long *)(NULLC::commonLinker + 0x200)));
      uVar2 = uVar2 + 1;
      puVar3 = puVar3 + 3;
    } while (uVar2 < type->pointerCount);
  }
  return;
}

Assistant:

void CheckClass(char* ptr, const ExternTypeInfo& type)
	{
		if(type.nameHash == objectName)
		{
			NULLCRef *data = (NULLCRef*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			CheckPointer((char*)&data->ptr);
		}
		else if(type.nameHash == autoArrayName)
		{
			NULLCAutoArray *data = (NULLCAutoArray*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			// Check target data
			CheckPointer((char*)&data->ptr);
		}
		else
		{
			const ExternTypeInfo *realType = &type;

			// Get class member type list
			ExternMemberInfo *memberList = realType->pointerCount ? &NULLC::commonLinker->exTypeExtra[realType->memberOffset + realType->memberCount] : NULL;

			// Check pointer members
			for(unsigned n = 0; n < realType->pointerCount; n++)
			{
				// Get member type
				ExternTypeInfo &subType = NULLC::commonLinker->exTypes[memberList[n].type];
				unsigned pos = memberList[n].offset;

				// Check member
				CheckVariable(ptr + pos, subType);
			}
		}
	}